

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall
Omega_h::clamp_metrics_dim<2>(Omega_h *this,LO nmetrics,Reals *metrics,Real h_min,Real h_max)

{
  void *extraout_RDX;
  Reals RVar1;
  Write<double> out;
  type functor;
  allocator local_79;
  Write<double> local_78;
  Real local_68;
  Real local_60;
  Write<signed_char> local_58;
  undefined1 local_48 [32];
  Write<double> local_28;
  
  local_68 = h_min;
  local_60 = h_max;
  std::__cxx11::string::string((string *)local_48,"",&local_79);
  Write<double>::Write(&local_78,nmetrics * 3,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  Write<double>::Write((Write<double> *)local_48,&metrics->write_);
  local_48._16_8_ = local_68;
  local_48._24_8_ = local_60;
  Write<double>::Write(&local_28,&local_78);
  parallel_for<Omega_h::clamp_metrics_dim<2>(int,Omega_h::Read<double>,double,double)::_lambda(int)_1_>
            (nmetrics,(type *)local_48,"clamp_metrics");
  Write<double>::Write(&local_58,(Write<signed_char> *)&local_78);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_58);
  Write<double>::~Write((Write<double> *)&local_58);
  clamp_metrics_dim<2>(int,Omega_h::Read<double>,double,double)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_48);
  Write<double>::~Write(&local_78);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals clamp_metrics_dim(
    LO nmetrics, Reals metrics, Real h_min, Real h_max) {
  auto out = Write<Real>(nmetrics * symm_ncomps(dim));
  auto functor = OMEGA_H_LAMBDA(LO i) {
    auto m = get_symm<dim>(metrics, i);
    m = clamp_metric(m, h_min, h_max);
    set_symm(out, i, m);
  };
  parallel_for("clamp_metrics", nmetrics, std::move(functor));
  return out;
}